

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

void Bdc_SpfdDecomposeTest3(void)

{
  Vec_Wrd_t *p;
  word wVar1;
  Vec_Wrd_t *p_00;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  int local_28;
  int Counter;
  int k;
  int i;
  Vec_Wrd_t *v1K;
  Vec_Wrd_t *v1M;
  int nSizeK;
  int nSizeM;
  
  Aig_ManRandom64(1);
  p = Vec_WrdAlloc(0x4000000);
  for (Counter = 0; Counter < 0x4000000; Counter = Counter + 1) {
    wVar1 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar1);
  }
  p_00 = Vec_WrdAlloc(8);
  for (Counter = 0; Counter < 8; Counter = Counter + 1) {
    wVar1 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar1);
  }
  aVar2 = Abc_Clock();
  clk._4_4_ = 0;
  for (Counter = 0; Counter < 0x4000000; Counter = Counter + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      clk._4_4_ = ((p->pArray[Counter] & p_00->pArray[local_28]) == p_00->pArray[local_28]) +
                  clk._4_4_;
    }
  }
  printf("Total = %8d.  ",(ulong)clk._4_4_);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  aVar2 = Abc_Clock();
  clk._4_4_ = 0;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    for (Counter = 0; Counter < 0x4000000; Counter = Counter + 1) {
      clk._4_4_ = ((p->pArray[Counter] & p_00->pArray[local_28]) == p_00->pArray[local_28]) +
                  clk._4_4_;
    }
  }
  printf("Total = %8d.  ",(ulong)clk._4_4_);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest3()
{
    int nSizeM = (1 << 26);
    int nSizeK = (1 << 3);
    Vec_Wrd_t * v1M;
    Vec_Wrd_t * v1K;
    int i, k, Counter;
    abctime clk;
//    int EntryM, EntryK;
    Aig_ManRandom64( 1 );

    v1M = Vec_WrdAlloc( nSizeM );
    for ( i = 0; i < nSizeM; i++ )
        Vec_WrdPush( v1M, Aig_ManRandom64(0) );

    v1K = Vec_WrdAlloc( nSizeK );
    for ( i = 0; i < nSizeK; i++ )
        Vec_WrdPush( v1K, Aig_ManRandom64(0) );

    clk = Abc_Clock();
    Counter = 0;
    for ( i = 0; i < nSizeM; i++ )
    for ( k = 0; k < nSizeK; k++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
//    Vec_WrdForEachEntry( v1M, EntryM, i )
//    Vec_WrdForEachEntry( v1K, EntryK, k )
//        Counter += ((EntryM & EntryK) == EntryK);

    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    Counter = 0;
    for ( k = 0; k < nSizeK; k++ )
    for ( i = 0; i < nSizeM; i++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}